

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

MultiBranchInstr * IR::MultiBranchInstr::New(OpCode opcode,Opnd *srcOpnd,Func *func)

{
  MultiBranchInstr *this;
  
  this = New(opcode,func);
  Instr::SetSrc1((Instr *)this,srcOpnd);
  return this;
}

Assistant:

MultiBranchInstr *
MultiBranchInstr::New(Js::OpCode opcode, IR::Opnd * srcOpnd, Func * func)
{
   MultiBranchInstr * multiBranchInstr;

   multiBranchInstr = MultiBranchInstr::New(opcode, func);

   multiBranchInstr->SetSrc1(srcOpnd);

   return multiBranchInstr;
}